

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O1

Event * __thiscall binlog::EventStream::nextEvent(EventStream *this,EntryStream *input)

{
  uint64_t eventSourceId;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint64_t *extraout_RDX;
  Event *unaff_R12;
  Range range_00;
  Range range_01;
  Range range_02;
  Range range_03;
  Range range;
  Range local_40;
  
  do {
    iVar2 = (*input->_vptr_EntryStream[2])(input);
    local_40._begin = (char *)CONCAT44(extraout_var,iVar2);
    if ((uint64_t *)local_40._begin == extraout_RDX) {
      bVar1 = false;
      unaff_R12 = (Event *)0x0;
    }
    else {
      local_40._end = (char *)extraout_RDX;
      Range::throw_if_overflow(&local_40,8);
      eventSourceId = *(uint64_t *)local_40._begin;
      range_00._begin = (uint64_t *)((long)local_40._begin + 8);
      local_40._begin = (char *)range_00._begin;
      if ((long)eventSourceId < 0) {
        bVar1 = true;
        if (eventSourceId == 0xfffffffffffffffd) {
          range_03._end = local_40._end;
          range_03._begin = (char *)range_00._begin;
          readClockSync(this,range_03);
        }
        else if (eventSourceId == 0xfffffffffffffffe) {
          range_02._end = local_40._end;
          range_02._begin = (char *)range_00._begin;
          readWriterProp(this,range_02);
        }
        else if (eventSourceId == 0xffffffffffffffff) {
          range_01._end = local_40._end;
          range_01._begin = (char *)range_00._begin;
          readEventSource(this,range_01);
        }
      }
      else {
        range_00._end = local_40._end;
        readEvent(this,eventSourceId,range_00);
        bVar1 = false;
        unaff_R12 = &this->_event;
      }
    }
  } while (bVar1);
  return unaff_R12;
}

Assistant:

const Event* EventStream::nextEvent(EntryStream& input)
{
  while (true)
  {
    Range range = input.nextEntryPayload();
    if (range.empty()) { return nullptr; }

    const std::uint64_t tag = range.read<std::uint64_t>();
    const bool special = (tag & (std::uint64_t(1) << 63)) != 0;

    if (special)
    {
      switch (tag)
      {
        case EventSource::Tag:
          readEventSource(range);
          break;
        case WriterProp::Tag:
          readWriterProp(range);
          break;
        case ClockSync::Tag:
          readClockSync(range);
          break;
        // default: ignore unkown special entries
        // to be forward compatible.
      }
    }
    else
    {
      readEvent(tag, range);
      return &_event;
    }
  }
}